

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageview.cpp
# Opt level: O3

int __thiscall QtMWidgets::PageView::indexOf(PageView *this,QWidget *widget)

{
  PageViewPrivate *pPVar1;
  long lVar2;
  long lVar3;
  
  pPVar1 = (this->d).d;
  lVar2 = (pPVar1->pages).d.size;
  if (0 < lVar2) {
    lVar3 = 0;
    do {
      if ((pPVar1->pages).d.ptr[lVar3] == widget) {
        return (int)lVar3;
      }
      lVar3 = lVar3 + 1;
    } while (lVar2 != lVar3);
  }
  return -1;
}

Assistant:

int
PageView::indexOf( QWidget * widget ) const
{
	for( int i = 0; i < d->pages.count(); ++i )
	{
		if( d->pages.at( i ) == widget )
			return i;
	}

	return -1;
}